

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLayerNormalizationNoGammaOrBeta(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *pCVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  LayerNormalizationLayerParams *this_01;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  WeightParams *this_02;
  int iVar12;
  int iVar13;
  Result res1;
  Model m;
  Result res2;
  undefined1 local_98 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Model local_70;
  Result local_40;
  
  CoreML::Specification::Model::Model(&local_70);
  if (local_70.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_70.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_70.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_98 + 0x10;
  local_98._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_98);
  if ((pointer)local_98._0_8_ != pcVar2) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar13 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 5;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 2;
  if (local_70.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_70.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_70.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_98._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_98);
  if ((pointer)local_98._0_8_ != pcVar2) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar13 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 3;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  iVar12 = iVar13 + 1;
  (pAVar8->shape_).current_size_ = iVar12;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 5;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar13 + 1);
  }
  iVar13 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 2;
  if (local_70._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_70);
    local_70._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_70.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_70.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_70.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x546) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x546;
    this_01 = (LayerNormalizationLayerParams *)operator_new(0x40);
    CoreML::Specification::LayerNormalizationLayerParams::LayerNormalizationLayerParams(this_01);
    (this_00->layer_).layernormalization_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  iVar13 = (pCVar3->kernelsize_).total_size_;
  if ((pCVar3->kernelsize_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve
              ((RepeatedField<long> *)&pCVar3->kernelsize_,iVar13 + 1);
  }
  iVar13 = (pCVar3->kernelsize_).current_size_;
  (pCVar3->kernelsize_).current_size_ = iVar13 + 1;
  ((pCVar3->kernelsize_).rep_)->elements[iVar13] = 1;
  CoreML::validate<(MLModelType)500>((Result *)local_98,&local_70);
  bVar4 = CoreML::Result::good((Result *)local_98);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_((Result *)local_98);
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x339c2d,0);
    if (lVar11 != -1) {
      lVar11._0_4_ = (pCVar3->stride_).current_size_;
      lVar11._4_4_ = (pCVar3->stride_).total_size_;
      if (lVar11 == 0) {
        this_02 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(this_02);
        *(WeightParams **)&pCVar3->stride_ = this_02;
      }
      lVar11 = *(long *)&pCVar3->stride_;
      if (*(int *)(lVar11 + 0x10) == *(int *)(lVar11 + 0x14)) {
        google::protobuf::RepeatedField<float>::Reserve
                  ((RepeatedField<float> *)(lVar11 + 0x10),*(int *)(lVar11 + 0x14) + 1);
      }
      iVar13 = *(int *)(lVar11 + 0x10);
      *(int *)(lVar11 + 0x10) = iVar13 + 1;
      *(undefined4 *)(*(long *)(lVar11 + 0x18) + 8 + (long)iVar13 * 4) = 0x3f800000;
      CoreML::validate<(MLModelType)500>(&local_40,&local_70);
      bVar4 = CoreML::Result::good(&local_40);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
LAB_001a1cbb:
        std::ostream::put((char)poVar9);
        iVar13 = 1;
        std::ostream::flush();
      }
      else {
        psVar10 = CoreML::Result::message_abi_cxx11_(&local_40);
        iVar13 = 0;
        lVar11 = std::__cxx11::string::find((char *)psVar10,0x339c65,0);
        if (lVar11 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"res2.message().find(\"Beta\") != std::string::npos",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          goto LAB_001a1cbb;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40.m_message._M_dataplus._M_p != &local_40.m_message.field_2) {
        operator_delete(local_40.m_message._M_dataplus._M_p,
                        local_40.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001a1cee;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"res1.message().find(\"Gamma\") != std::string::npos",0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  iVar13 = 1;
  std::ostream::flush();
LAB_001a1cee:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._8_8_ != &local_80) {
    operator_delete((void *)local_98._8_8_,local_80._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_70);
  return iVar13;
}

Assistant:

int testInvalidLayerNormalizationNoGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    // not specifying the gamma parameter
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Gamma") != std::string::npos);

    // not specifying the beta parameter
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("Beta") != std::string::npos);

    return 0;

}